

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::sse42::
     BVHNIntersector1<4,_16777232,_false,_embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 *puVar8;
  float *pfVar9;
  undefined4 *puVar10;
  float *pfVar11;
  undefined4 *puVar12;
  float *pfVar13;
  undefined4 *puVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  float *pfVar24;
  float *pfVar25;
  float *pfVar26;
  float *pfVar27;
  float *pfVar28;
  float *pfVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  Intersectors *pIVar36;
  Ref<embree::Geometry> *pRVar37;
  Geometry *pGVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  RTCIntersectArguments *pRVar42;
  bool bVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 (*pauVar50) [16];
  int iVar51;
  undefined4 uVar52;
  undefined1 (*pauVar53) [16];
  long lVar54;
  undefined4 uVar55;
  AABBNodeMB4D *node1;
  ulong uVar56;
  RTCRayQueryContext *pRVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  ulong uVar62;
  Intersectors *pIVar63;
  ulong uVar64;
  uint uVar65;
  long lVar66;
  undefined8 uVar67;
  ulong uVar68;
  long lVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  ulong uVar73;
  float fVar85;
  float fVar87;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar86;
  float fVar88;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar103;
  float fVar110;
  float fVar112;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar104;
  float fVar105;
  float fVar111;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar109 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar131;
  float fVar132;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  float fVar153;
  uint uVar154;
  float fVar155;
  uint uVar156;
  float fVar157;
  uint uVar158;
  float fVar159;
  uint uVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  undefined1 local_12a4 [16];
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  undefined1 local_1278 [8];
  uint uStack_1270;
  uint uStack_126c;
  ulong local_1260;
  undefined8 local_1258;
  float fStack_1250;
  float fStack_124c;
  undefined8 local_1248;
  float fStack_1240;
  float fStack_123c;
  undefined8 local_1238;
  float fStack_1230;
  float fStack_122c;
  undefined4 uStack_1228;
  undefined4 uStack_1224;
  ulong local_1220;
  undefined1 local_1218 [52];
  float fStack_11e4;
  float fStack_11e0;
  float fStack_11dc;
  undefined8 local_11d8;
  float fStack_11d0;
  float fStack_11cc;
  undefined8 local_11c8;
  float fStack_11c0;
  float fStack_11bc;
  float local_11b8;
  float fStack_11b4;
  float fStack_11b0;
  float fStack_11ac;
  float local_11a8;
  undefined4 local_11a4;
  undefined4 local_11a0;
  float local_119c;
  undefined4 local_1198;
  undefined4 local_1194;
  uint local_1190;
  uint local_118c;
  uint local_1188;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  undefined4 uStack_1168;
  undefined4 uStack_1164;
  Scene *local_1160;
  float local_1158;
  float fStack_1154;
  float fStack_1150;
  float fStack_114c;
  undefined8 local_1148;
  float fStack_1140;
  float fStack_113c;
  float local_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  undefined1 local_1128 [8];
  float fStack_1120;
  float fStack_111c;
  float local_1118;
  float fStack_1114;
  float fStack_1110;
  float fStack_110c;
  float local_1108;
  float fStack_1104;
  float fStack_1100;
  float fStack_10fc;
  undefined1 local_10f8 [16];
  undefined1 local_10d8 [16];
  float local_10c8 [4];
  undefined1 local_10b8 [8];
  float fStack_10b0;
  float fStack_10ac;
  float local_10a8 [4];
  float local_1098 [4];
  undefined8 local_1088;
  undefined8 uStack_1080;
  undefined8 local_1078;
  undefined8 uStack_1070;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  long local_1038;
  ulong local_1030;
  ulong local_1028;
  long local_1020;
  ulong local_1018;
  ulong local_1010;
  ulong local_1008;
  long local_1000;
  uint local_ff8;
  uint uStack_ff4;
  uint uStack_ff0;
  uint uStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    pauVar53 = (undefined1 (*) [16])local_f68;
    uStack_f70 = 0;
    auVar120._0_4_ = (ray->super_RayK<1>).org.field_0.m128[0];
    auVar120._4_4_ = (ray->super_RayK<1>).org.field_0.m128[1];
    auVar120._8_4_ = (ray->super_RayK<1>).org.field_0.m128[2];
    auVar109._0_4_ = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
    aVar33 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar109._4_4_ = 0.0;
    if (0.0 <= auVar109._0_4_) {
      auVar109._4_4_ = auVar109._0_4_;
    }
    auVar109._0_4_ = (ray->super_RayK<1>).tfar;
    fVar103 = 0.0;
    if (0.0 <= auVar109._0_4_) {
      fVar103 = auVar109._0_4_;
    }
    auVar74._4_4_ = -(uint)(ABS(aVar33.y) < DAT_01f80d30._4_4_);
    auVar74._0_4_ = -(uint)(ABS(aVar33.x) < (float)DAT_01f80d30);
    auVar74._8_4_ = -(uint)(ABS(aVar33.z) < DAT_01f80d30._8_4_);
    auVar74._12_4_ = -(uint)(ABS(aVar33.field_3.w) < DAT_01f80d30._12_4_);
    auVar121 = blendvps((undefined1  [16])aVar33,_DAT_01f80d30,auVar74);
    auVar74 = rcpps(auVar74,auVar121);
    fVar146 = auVar74._0_4_;
    fVar147 = auVar74._4_4_;
    fVar148 = auVar74._8_4_;
    fVar146 = (1.0 - auVar121._0_4_ * fVar146) * fVar146 + fVar146;
    fVar147 = (1.0 - auVar121._4_4_ * fVar147) * fVar147 + fVar147;
    fVar148 = (1.0 - auVar121._8_4_ * fVar148) * fVar148 + fVar148;
    uVar64 = (ulong)(fVar146 < 0.0) << 4;
    uVar68 = (ulong)(fVar147 < 0.0) << 4 | 0x20;
    uVar73 = (ulong)(fVar148 < 0.0) << 4 | 0x40;
    uVar71 = uVar64 ^ 0x10;
    uVar72 = uVar68 ^ 0x10;
    auVar121._4_4_ = fVar103;
    auVar121._0_4_ = fVar103;
    auVar121._8_4_ = fVar103;
    auVar121._12_4_ = fVar103;
    _local_ff8 = mm_lookupmask_ps._240_8_;
    _uStack_ff0 = mm_lookupmask_ps._248_8_;
    local_1220 = uVar64;
    local_1260 = uVar68;
    local_12a4._4_8_ = context;
    local_f88 = auVar120._8_4_;
    fStack_f84 = auVar120._8_4_;
    fStack_f80 = auVar120._8_4_;
    fStack_f7c = auVar120._8_4_;
    local_f98 = auVar109._4_4_;
    fStack_f94 = auVar109._4_4_;
    fStack_f90 = auVar109._4_4_;
    fStack_f8c = auVar109._4_4_;
    local_fa8 = fVar148;
    fStack_fa4 = fVar148;
    fStack_fa0 = fVar148;
    fStack_f9c = fVar148;
    local_fb8 = auVar120._0_4_;
    fStack_fb4 = auVar120._0_4_;
    fStack_fb0 = auVar120._0_4_;
    fStack_fac = auVar120._0_4_;
    local_fc8 = auVar120._4_4_;
    fStack_fc4 = auVar120._4_4_;
    fStack_fc0 = auVar120._4_4_;
    fStack_fbc = auVar120._4_4_;
    local_fd8 = fVar146;
    fStack_fd4 = fVar146;
    fStack_fd0 = fVar146;
    fStack_fcc = fVar146;
    local_fe8 = fVar147;
    fStack_fe4 = fVar147;
    fStack_fe0 = fVar147;
    fStack_fdc = fVar147;
    fVar111 = fVar147;
    fVar105 = fVar147;
    fVar104 = fVar147;
    fVar102 = fVar146;
    fVar101 = fVar146;
    fVar100 = fVar146;
    fVar99 = auVar120._4_4_;
    fVar98 = auVar120._4_4_;
    fVar97 = auVar120._4_4_;
    fVar91 = auVar120._0_4_;
    fVar90 = auVar120._0_4_;
    fVar89 = auVar120._0_4_;
    fVar88 = fVar148;
    fVar87 = fVar148;
    auVar120._12_4_ = fVar148;
    fVar86 = auVar109._4_4_;
    fVar85 = auVar109._4_4_;
    auVar109._12_4_ = auVar109._4_4_;
    auVar109._8_4_ = auVar120._8_4_;
    fVar110 = auVar120._8_4_;
    fVar103 = auVar120._8_4_;
LAB_00d9e73f:
    do {
      pauVar50 = pauVar53 + -1;
      pauVar53 = pauVar53 + -1;
      if (*(float *)((long)*pauVar50 + 8) <= auVar109._0_4_) {
        pIVar63 = *(Intersectors **)*pauVar53;
        while (((ulong)pIVar63 & 8) == 0) {
          fVar112 = (ray->super_RayK<1>).dir.field_0.m128[3];
          auVar109._0_4_ = (ray->super_RayK<1>).tfar;
          uVar56 = (ulong)pIVar63 & 0xfffffffffffffff0;
          pfVar32 = (float *)(uVar56 + 0x80 + uVar64);
          pfVar31 = (float *)(uVar56 + 0x20 + uVar64);
          auVar125._0_4_ = ((*pfVar32 * fVar112 + *pfVar31) - fVar89) * fVar100;
          auVar125._4_4_ = ((pfVar32[1] * fVar112 + pfVar31[1]) - fVar90) * fVar101;
          auVar125._8_4_ = ((pfVar32[2] * fVar112 + pfVar31[2]) - fVar91) * fVar102;
          auVar125._12_4_ = ((pfVar32[3] * fVar112 + pfVar31[3]) - auVar120._0_4_) * fVar146;
          auVar122._4_4_ = fVar85;
          auVar122._0_4_ = auVar109._12_4_;
          auVar122._8_4_ = fVar86;
          auVar122._12_4_ = auVar109._4_4_;
          auVar74 = maxps(auVar122,auVar125);
          pfVar32 = (float *)(uVar56 + 0x80 + uVar68);
          pfVar31 = (float *)(uVar56 + 0x20 + uVar68);
          auVar129._0_4_ = ((*pfVar32 * fVar112 + *pfVar31) - fVar97) * fVar104;
          auVar129._4_4_ = ((pfVar32[1] * fVar112 + pfVar31[1]) - fVar98) * fVar105;
          auVar129._8_4_ = ((pfVar32[2] * fVar112 + pfVar31[2]) - fVar99) * fVar111;
          auVar129._12_4_ = ((pfVar32[3] * fVar112 + pfVar31[3]) - auVar120._4_4_) * fVar147;
          pfVar32 = (float *)(uVar56 + 0x80 + uVar73);
          pfVar31 = (float *)(uVar56 + 0x20 + uVar73);
          auVar126._0_4_ = ((*pfVar32 * fVar112 + *pfVar31) - fVar103) * auVar120._12_4_;
          auVar126._4_4_ = ((pfVar32[1] * fVar112 + pfVar31[1]) - fVar110) * fVar87;
          auVar126._8_4_ = ((pfVar32[2] * fVar112 + pfVar31[2]) - auVar109._8_4_) * fVar88;
          auVar126._12_4_ = ((pfVar32[3] * fVar112 + pfVar31[3]) - auVar120._8_4_) * fVar148;
          auVar122 = maxps(auVar129,auVar126);
          _local_1128 = maxps(auVar74,auVar122);
          pfVar32 = (float *)(uVar56 + 0x80 + uVar71);
          pfVar31 = (float *)(uVar56 + 0x20 + uVar71);
          auVar127._0_4_ = ((*pfVar32 * fVar112 + *pfVar31) - fVar89) * fVar100;
          auVar127._4_4_ = ((pfVar32[1] * fVar112 + pfVar31[1]) - fVar90) * fVar101;
          auVar127._8_4_ = ((pfVar32[2] * fVar112 + pfVar31[2]) - fVar91) * fVar102;
          auVar127._12_4_ = ((pfVar32[3] * fVar112 + pfVar31[3]) - auVar120._0_4_) * fVar146;
          pfVar32 = (float *)(uVar56 + 0x80 + uVar72);
          pfVar31 = (float *)(uVar56 + 0x20 + uVar72);
          auVar133._0_4_ = ((*pfVar32 * fVar112 + *pfVar31) - fVar97) * fVar104;
          auVar133._4_4_ = ((pfVar32[1] * fVar112 + pfVar31[1]) - fVar98) * fVar105;
          auVar133._8_4_ = ((pfVar32[2] * fVar112 + pfVar31[2]) - fVar99) * fVar111;
          auVar133._12_4_ = ((pfVar32[3] * fVar112 + pfVar31[3]) - auVar120._4_4_) * fVar147;
          pfVar32 = (float *)(uVar56 + 0x80 + (uVar73 ^ 0x10));
          pfVar31 = (float *)(uVar56 + 0x20 + (uVar73 ^ 0x10));
          auVar135._0_4_ = ((*pfVar32 * fVar112 + *pfVar31) - fVar103) * auVar120._12_4_;
          auVar135._4_4_ = ((pfVar32[1] * fVar112 + pfVar31[1]) - fVar110) * fVar87;
          auVar135._8_4_ = ((pfVar32[2] * fVar112 + pfVar31[2]) - auVar109._8_4_) * fVar88;
          auVar135._12_4_ = ((pfVar32[3] * fVar112 + pfVar31[3]) - auVar120._8_4_) * fVar148;
          auVar122 = minps(auVar133,auVar135);
          auVar74 = minps(auVar121,auVar127);
          auVar74 = minps(auVar74,auVar122);
          if (((uint)pIVar63 & 7) == 6) {
            bVar43 = (fVar112 < *(float *)(uVar56 + 0xf0) && *(float *)(uVar56 + 0xe0) <= fVar112)
                     && local_1128._0_4_ <= auVar74._0_4_;
            bVar44 = (fVar112 < *(float *)(uVar56 + 0xf4) && *(float *)(uVar56 + 0xe4) <= fVar112)
                     && local_1128._4_4_ <= auVar74._4_4_;
            bVar45 = (fVar112 < *(float *)(uVar56 + 0xf8) && *(float *)(uVar56 + 0xe8) <= fVar112)
                     && local_1128._8_4_ <= auVar74._8_4_;
            bVar46 = (fVar112 < *(float *)(uVar56 + 0xfc) && *(float *)(uVar56 + 0xec) <= fVar112)
                     && local_1128._12_4_ <= auVar74._12_4_;
          }
          else {
            bVar43 = local_1128._0_4_ <= auVar74._0_4_;
            bVar44 = local_1128._4_4_ <= auVar74._4_4_;
            bVar45 = local_1128._8_4_ <= auVar74._8_4_;
            bVar46 = local_1128._12_4_ <= auVar74._12_4_;
          }
          auVar106._0_4_ = (uint)bVar43 * -0x80000000;
          auVar106._4_4_ = (uint)bVar44 * -0x80000000;
          auVar106._8_4_ = (uint)bVar45 * -0x80000000;
          auVar106._12_4_ = (uint)bVar46 * -0x80000000;
          uVar65 = movmskps((int)This,auVar106);
          This = (Intersectors *)(ulong)uVar65;
          if (uVar65 == 0) {
            if (pauVar53 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            goto LAB_00d9e73f;
          }
          This = (Intersectors *)0x0;
          if ((byte)uVar65 != 0) {
            for (; ((byte)uVar65 >> (long)This & 1) == 0;
                This = (Intersectors *)((long)&This->ptr + 1)) {
            }
          }
          pIVar63 = *(Intersectors **)(uVar56 + (long)This * 8);
          uVar65 = (uVar65 & 0xff) - 1 & uVar65 & 0xff;
          if (uVar65 != 0) {
            uVar149 = *(uint *)(local_1128 + (long)This * 4);
            lVar66 = 0;
            if (uVar65 != 0) {
              for (; (uVar65 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
              }
            }
            pIVar36 = *(Intersectors **)(uVar56 + lVar66 * 8);
            uVar150 = *(uint *)(local_1128 + lVar66 * 4);
            uVar65 = uVar65 - 1 & uVar65;
            uVar64 = local_1220;
            uVar68 = local_1260;
            if (uVar65 == 0) {
              This = pIVar36;
              if (uVar149 < uVar150) {
                *(Intersectors **)*pauVar53 = pIVar36;
                *(uint *)((long)*pauVar53 + 8) = uVar150;
                pauVar53 = pauVar53 + 1;
              }
              else {
                *(Intersectors **)*pauVar53 = pIVar63;
                *(uint *)((long)*pauVar53 + 8) = uVar149;
                pauVar53 = pauVar53 + 1;
                pIVar63 = pIVar36;
              }
            }
            else {
              auVar107._8_4_ = uVar149;
              auVar107._0_8_ = pIVar63;
              auVar107._12_4_ = 0;
              auVar123._8_4_ = uVar150;
              auVar123._0_8_ = pIVar36;
              auVar123._12_4_ = 0;
              This = (Intersectors *)0x0;
              if (uVar65 != 0) {
                for (; (uVar65 >> (long)This & 1) == 0;
                    This = (Intersectors *)((long)&This->ptr + 1)) {
                }
              }
              uVar67 = *(undefined8 *)(uVar56 + (long)This * 8);
              iVar51 = *(int *)(local_1128 + (long)This * 4);
              auVar116._8_4_ = iVar51;
              auVar116._0_8_ = uVar67;
              auVar116._12_4_ = 0;
              auVar75._8_4_ = -(uint)((int)uVar149 < (int)uVar150);
              uVar65 = uVar65 - 1 & uVar65;
              if (uVar65 == 0) {
                auVar75._4_4_ = auVar75._8_4_;
                auVar75._0_4_ = auVar75._8_4_;
                auVar75._12_4_ = auVar75._8_4_;
                auVar128._8_4_ = uVar150;
                auVar128._0_8_ = pIVar36;
                auVar128._12_4_ = 0;
                auVar122 = blendvps(auVar128,auVar107,auVar75);
                auVar74 = blendvps(auVar107,auVar123,auVar75);
                auVar76._8_4_ = -(uint)(auVar122._8_4_ < iVar51);
                auVar76._4_4_ = auVar76._8_4_;
                auVar76._0_4_ = auVar76._8_4_;
                auVar76._12_4_ = auVar76._8_4_;
                auVar124._8_4_ = iVar51;
                auVar124._0_8_ = uVar67;
                auVar124._12_4_ = 0;
                auVar125 = blendvps(auVar124,auVar122,auVar76);
                auVar129 = blendvps(auVar122,auVar116,auVar76);
                auVar77._8_4_ = -(uint)(auVar74._8_4_ < auVar129._8_4_);
                auVar77._4_4_ = auVar77._8_4_;
                auVar77._0_4_ = auVar77._8_4_;
                auVar77._12_4_ = auVar77._8_4_;
                auVar122 = blendvps(auVar129,auVar74,auVar77);
                auVar74 = blendvps(auVar74,auVar129,auVar77);
                *pauVar53 = auVar74;
                pauVar53[1] = auVar122;
                pIVar63 = auVar125._0_8_;
                pauVar53 = pauVar53 + 2;
              }
              else {
                This = (Intersectors *)0x0;
                if (uVar65 != 0) {
                  for (; (uVar65 >> (long)This & 1) == 0;
                      This = (Intersectors *)((long)&This->ptr + 1)) {
                  }
                }
                auVar78._4_4_ = auVar75._8_4_;
                auVar78._0_4_ = auVar75._8_4_;
                auVar78._8_4_ = auVar75._8_4_;
                auVar78._12_4_ = auVar75._8_4_;
                auVar129 = blendvps(auVar123,auVar107,auVar78);
                auVar74 = blendvps(auVar107,auVar123,auVar78);
                auVar134._8_4_ = *(int *)(local_1128 + (long)This * 4);
                auVar134._0_8_ = *(undefined8 *)(uVar56 + (long)This * 8);
                auVar134._12_4_ = 0;
                auVar79._8_4_ = -(uint)(iVar51 < *(int *)(local_1128 + (long)This * 4));
                auVar79._4_4_ = auVar79._8_4_;
                auVar79._0_4_ = auVar79._8_4_;
                auVar79._12_4_ = auVar79._8_4_;
                auVar125 = blendvps(auVar134,auVar116,auVar79);
                auVar122 = blendvps(auVar116,auVar134,auVar79);
                auVar80._8_4_ = -(uint)(auVar74._8_4_ < auVar122._8_4_);
                auVar80._4_4_ = auVar80._8_4_;
                auVar80._0_4_ = auVar80._8_4_;
                auVar80._12_4_ = auVar80._8_4_;
                auVar135 = blendvps(auVar122,auVar74,auVar80);
                auVar74 = blendvps(auVar74,auVar122,auVar80);
                auVar81._8_4_ = -(uint)(auVar129._8_4_ < auVar125._8_4_);
                auVar81._4_4_ = auVar81._8_4_;
                auVar81._0_4_ = auVar81._8_4_;
                auVar81._12_4_ = auVar81._8_4_;
                auVar122 = blendvps(auVar125,auVar129,auVar81);
                auVar129 = blendvps(auVar129,auVar125,auVar81);
                auVar82._8_4_ = -(uint)(auVar129._8_4_ < auVar135._8_4_);
                auVar82._4_4_ = auVar82._8_4_;
                auVar82._0_4_ = auVar82._8_4_;
                auVar82._12_4_ = auVar82._8_4_;
                auVar125 = blendvps(auVar135,auVar129,auVar82);
                auVar129 = blendvps(auVar129,auVar135,auVar82);
                *pauVar53 = auVar74;
                pauVar53[1] = auVar129;
                pauVar53[2] = auVar125;
                pIVar63 = auVar122._0_8_;
                pauVar53 = pauVar53 + 3;
              }
            }
          }
        }
        local_1038 = (ulong)((uint)pIVar63 & 0xf) - 8;
        if (local_1038 != 0) {
          uVar64 = (ulong)pIVar63 & 0xfffffffffffffff0;
          local_1000 = 0;
          do {
            lVar66 = local_1000 * 0x60;
            local_1160 = context->scene;
            pRVar37 = (context->scene->geometries).items;
            pGVar38 = pRVar37[*(uint *)(uVar64 + 0x40 + lVar66)].ptr;
            auVar120._0_4_ = (pGVar38->time_range).lower;
            auVar120._4_4_ =
                 (((ray->super_RayK<1>).dir.field_0.m128[3] - auVar120._0_4_) /
                 ((pGVar38->time_range).upper - auVar120._0_4_)) * pGVar38->fnumTimeSegments;
            auVar108 = roundss(ZEXT816(0),ZEXT416((uint)auVar120._4_4_),9);
            auVar120._0_4_ = pGVar38->fnumTimeSegments + -1.0;
            if (auVar120._0_4_ <= auVar108._0_4_) {
              auVar108._0_4_ = auVar120._0_4_;
            }
            auVar120._0_4_ = 0.0;
            if (0.0 <= auVar108._0_4_) {
              auVar120._0_4_ = auVar108._0_4_;
            }
            lVar69 = (long)(int)auVar120._0_4_ * 0x38;
            lVar39 = *(long *)(*(long *)&pGVar38[2].numPrimitives + lVar69);
            local_1010 = (ulong)*(uint *)(uVar64 + 4 + lVar66);
            pfVar31 = (float *)(lVar39 + (ulong)*(uint *)(uVar64 + lVar66) * 4);
            uVar68 = (ulong)*(uint *)(uVar64 + 0x10 + lVar66);
            pfVar32 = (float *)(lVar39 + uVar68 * 4);
            uVar56 = (ulong)*(uint *)(uVar64 + 0x20 + lVar66);
            pfVar1 = (float *)(lVar39 + uVar56 * 4);
            uVar58 = (ulong)*(uint *)(uVar64 + 0x30 + lVar66);
            pfVar2 = (float *)(lVar39 + uVar58 * 4);
            local_1020 = *(long *)&pRVar37[*(uint *)(uVar64 + 0x44 + lVar66)].ptr[2].numPrimitives;
            lVar39 = *(long *)(local_1020 + lVar69);
            pfVar3 = (float *)(lVar39 + local_1010 * 4);
            uVar59 = (ulong)*(uint *)(uVar64 + 0x14 + lVar66);
            pfVar4 = (float *)(lVar39 + uVar59 * 4);
            uVar60 = (ulong)*(uint *)(uVar64 + 0x24 + lVar66);
            pfVar5 = (float *)(lVar39 + uVar60 * 4);
            uVar61 = (ulong)*(uint *)(uVar64 + 0x34 + lVar66);
            pfVar6 = (float *)(lVar39 + uVar61 * 4);
            lVar39 = *(long *)&pRVar37[*(uint *)(uVar64 + 0x48 + lVar66)].ptr[2].numPrimitives;
            lVar40 = *(long *)(lVar39 + lVar69);
            uVar62 = (ulong)*(uint *)(uVar64 + 8 + lVar66);
            pfVar7 = (float *)(lVar40 + uVar62 * 4);
            local_1018 = (ulong)*(uint *)(uVar64 + 0x18 + lVar66);
            puVar8 = (undefined4 *)(lVar40 + local_1018 * 4);
            local_1008 = (ulong)*(uint *)(uVar64 + 0x28 + lVar66);
            pfVar9 = (float *)(lVar40 + local_1008 * 4);
            puVar10 = (undefined4 *)(lVar40 + (ulong)*(uint *)(uVar64 + 0x38 + lVar66) * 4);
            auVar120._4_4_ = auVar120._4_4_ - auVar120._0_4_;
            lVar40 = *(long *)&pRVar37[*(uint *)(uVar64 + 0x4c + lVar66)].ptr[2].numPrimitives;
            lVar69 = *(long *)(lVar40 + lVar69);
            This = (Intersectors *)(ulong)*(uint *)(uVar64 + 0xc + lVar66);
            pfVar11 = (float *)(lVar69 + (long)This * 4);
            uVar70 = (ulong)*(uint *)(uVar64 + 0x1c + lVar66);
            puVar12 = (undefined4 *)(lVar69 + uVar70 * 4);
            local_1030 = (ulong)*(uint *)(uVar64 + 0x2c + lVar66);
            pfVar13 = (float *)(lVar69 + local_1030 * 4);
            uVar65 = *(uint *)(uVar64 + 0x3c + lVar66);
            local_1028 = (ulong)uVar65;
            puVar14 = (undefined4 *)(lVar69 + local_1028 * 4);
            uStack_1228 = *puVar8;
            uStack_1224 = *puVar12;
            lVar54 = (long)((int)auVar120._0_4_ + 1) * 0x38;
            lVar69 = *(long *)(*(long *)&pGVar38[2].numPrimitives + lVar54);
            pfVar15 = (float *)(lVar69 + (ulong)*(uint *)(uVar64 + lVar66) * 4);
            local_1278._4_4_ = pfVar13[2];
            local_1278._0_4_ = pfVar9[2];
            lVar39 = *(long *)(lVar39 + lVar54);
            pfVar16 = (float *)(lVar39 + uVar62 * 4);
            local_1148 = (IntersectFunc16)CONCAT44(puVar14[2],puVar10[2]);
            uStack_1168 = *puVar10;
            uStack_1164 = *puVar14;
            lVar41 = *(long *)(local_1020 + lVar54);
            pfVar17 = (float *)(lVar41 + local_1010 * 4);
            lVar40 = *(long *)(lVar40 + lVar54);
            pfVar18 = (float *)(lVar40 + (long)This * 4);
            pfVar19 = (float *)(lVar69 + uVar68 * 4);
            pfVar20 = (float *)(lVar39 + local_1018 * 4);
            pfVar21 = (float *)(lVar41 + uVar59 * 4);
            pfVar22 = (float *)(lVar40 + uVar70 * 4);
            pfVar23 = (float *)(lVar69 + uVar56 * 4);
            pfVar24 = (float *)(lVar39 + local_1008 * 4);
            pfVar25 = (float *)(lVar41 + uVar60 * 4);
            pfVar26 = (float *)(lVar40 + local_1030 * 4);
            pfVar27 = (float *)(lVar69 + uVar58 * 4);
            pfVar28 = (float *)(lVar39 + (long)local_1148 * 4);
            pfVar29 = (float *)(lVar41 + uVar61 * 4);
            pfVar30 = (float *)(lVar40 + local_1028 * 4);
            auVar120._0_4_ = 1.0 - auVar120._4_4_;
            fVar89 = *pfVar31 * auVar120._0_4_ + *pfVar15 * auVar120._4_4_;
            fVar97 = *pfVar3 * auVar120._0_4_ + *pfVar17 * auVar120._4_4_;
            fVar100 = *pfVar7 * auVar120._0_4_ + *pfVar16 * auVar120._4_4_;
            fVar102 = *pfVar11 * auVar120._0_4_ + *pfVar18 * auVar120._4_4_;
            fVar90 = *pfVar9 * auVar120._0_4_ + pfVar15[1] * auVar120._4_4_;
            fVar98 = *pfVar13 * auVar120._0_4_ + pfVar17[1] * auVar120._4_4_;
            fStack_1240 = pfVar7[1] * auVar120._0_4_ + pfVar16[1] * auVar120._4_4_;
            fStack_123c = pfVar11[1] * auVar120._0_4_ + pfVar18[1] * auVar120._4_4_;
            local_1218._48_4_ = pfVar31[2] * auVar120._0_4_ + pfVar15[2] * auVar120._4_4_;
            fStack_11e4 = pfVar3[2] * auVar120._0_4_ + pfVar17[2] * auVar120._4_4_;
            fStack_11e0 = pfVar7[2] * auVar120._0_4_ + pfVar16[2] * auVar120._4_4_;
            fStack_11dc = pfVar11[2] * auVar120._0_4_ + pfVar18[2] * auVar120._4_4_;
            local_1238._0_4_ = *pfVar32 * auVar120._0_4_ + *pfVar19 * auVar120._4_4_;
            local_1238._4_4_ = *pfVar4 * auVar120._0_4_ + *pfVar21 * auVar120._4_4_;
            fStack_1230 = fStack_1230 * auVar120._0_4_ + *pfVar20 * auVar120._4_4_;
            fStack_122c = fStack_122c * auVar120._0_4_ + *pfVar22 * auVar120._4_4_;
            local_1048 = pfVar32[1] * auVar120._0_4_ + pfVar19[1] * auVar120._4_4_;
            fStack_1044 = pfVar4[1] * auVar120._0_4_ + pfVar21[1] * auVar120._4_4_;
            fStack_1040 = (float)puVar8[1] * auVar120._0_4_ + pfVar20[1] * auVar120._4_4_;
            fStack_103c = (float)puVar12[1] * auVar120._0_4_ + pfVar22[1] * auVar120._4_4_;
            local_11b8 = pfVar32[2] * auVar120._0_4_ + pfVar19[2] * auVar120._4_4_;
            fStack_11b4 = pfVar4[2] * auVar120._0_4_ + pfVar21[2] * auVar120._4_4_;
            fStack_11b0 = (float)puVar8[2] * auVar120._0_4_ + pfVar20[2] * auVar120._4_4_;
            fStack_11ac = (float)puVar12[2] * auVar120._0_4_ + pfVar22[2] * auVar120._4_4_;
            fVar103 = *pfVar1 * auVar120._0_4_ + *pfVar23 * auVar120._4_4_;
            fVar110 = *pfVar5 * auVar120._0_4_ + *pfVar25 * auVar120._4_4_;
            auVar109._0_4_ = fStack_1250 * auVar120._0_4_ + *pfVar24 * auVar120._4_4_;
            auVar109._4_4_ = fStack_124c * auVar120._0_4_ + *pfVar26 * auVar120._4_4_;
            local_1258._4_4_ = fVar110;
            local_1258._0_4_ = fVar103;
            fStack_1250 = auVar109._0_4_;
            fStack_124c = auVar109._4_4_;
            local_12a4._12_4_ = pfVar1[1] * auVar120._0_4_ + pfVar23[1] * auVar120._4_4_;
            fStack_1294 = pfVar5[1] * auVar120._0_4_ + pfVar25[1] * auVar120._4_4_;
            fStack_1290 = pfVar9[1] * auVar120._0_4_ + pfVar24[1] * auVar120._4_4_;
            fStack_128c = pfVar13[1] * auVar120._0_4_ + pfVar26[1] * auVar120._4_4_;
            local_1288 = pfVar1[2] * auVar120._0_4_ + pfVar23[2] * auVar120._4_4_;
            fStack_1284 = pfVar5[2] * auVar120._0_4_ + pfVar25[2] * auVar120._4_4_;
            fStack_1280 = fStack_1280 * auVar120._0_4_ + pfVar24[2] * auVar120._4_4_;
            fStack_127c = fStack_127c * auVar120._0_4_ + pfVar26[2] * auVar120._4_4_;
            local_1178 = *pfVar2 * auVar120._0_4_ + *pfVar27 * auVar120._4_4_;
            fStack_1174 = *pfVar6 * auVar120._0_4_ + *pfVar29 * auVar120._4_4_;
            fStack_1170 = fStack_1170 * auVar120._0_4_ + *pfVar28 * auVar120._4_4_;
            fStack_116c = fStack_116c * auVar120._0_4_ + *pfVar30 * auVar120._4_4_;
            local_1058 = pfVar2[1] * auVar120._0_4_ + pfVar27[1] * auVar120._4_4_;
            fStack_1054 = pfVar6[1] * auVar120._0_4_ + pfVar29[1] * auVar120._4_4_;
            fStack_1050 = (float)puVar10[1] * auVar120._0_4_ + pfVar28[1] * auVar120._4_4_;
            fStack_104c = (float)puVar14[1] * auVar120._0_4_ + pfVar30[1] * auVar120._4_4_;
            local_1068 = auVar120._0_4_ * pfVar2[2] + auVar120._4_4_ * pfVar27[2];
            fStack_1064 = auVar120._0_4_ * pfVar6[2] + auVar120._4_4_ * pfVar29[2];
            fStack_1060 = auVar120._0_4_ * fStack_1150 + auVar120._4_4_ * pfVar28[2];
            fStack_105c = auVar120._0_4_ * fStack_114c + auVar120._4_4_ * pfVar30[2];
            fVar131 = fVar90 - local_1048;
            fVar136 = fVar98 - fStack_1044;
            fVar138 = fStack_1240 - fStack_1040;
            fVar140 = fStack_123c - fStack_103c;
            fVar169 = (float)local_1218._48_4_ - local_11b8;
            fVar170 = fStack_11e4 - fStack_11b4;
            fVar171 = fStack_11e0 - fStack_11b0;
            fVar172 = fStack_11dc - fStack_11ac;
            fVar153 = local_1058 - fVar90;
            fVar155 = fStack_1054 - fVar98;
            fVar157 = fStack_1050 - fStack_1240;
            fVar159 = fStack_104c - fStack_123c;
            fVar161 = local_1068 - (float)local_1218._48_4_;
            fVar162 = fStack_1064 - fStack_11e4;
            fVar163 = fStack_1060 - fStack_11e0;
            fVar164 = fStack_105c - fStack_11dc;
            local_1098[0] = fVar169 * fVar153 - fVar131 * fVar161;
            local_1098[1] = fVar170 * fVar155 - fVar136 * fVar162;
            local_1098[2] = fVar171 * fVar157 - fVar138 * fVar163;
            local_1098[3] = fVar172 * fVar159 - fVar140 * fVar164;
            fVar142 = local_1178 - fVar89;
            fVar143 = fStack_1174 - fVar97;
            fVar144 = fStack_1170 - fVar100;
            fVar145 = fStack_116c - fVar102;
            auVar120._0_4_ = (ray->super_RayK<1>).org.field_0.m128[0];
            fStack_11d0 = (ray->super_RayK<1>).org.field_0.m128[1];
            auVar120._4_4_ = (ray->super_RayK<1>).org.field_0.m128[2];
            auVar120._8_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_1138 = (ray->super_RayK<1>).dir.field_0.m128[1];
            fStack_11c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_1148 = (IntersectFunc16)CONCAT44(auVar120._0_4_,auVar120._0_4_);
            fStack_1140 = auVar120._0_4_;
            fStack_113c = auVar120._0_4_;
            fVar104 = fVar89 - auVar120._0_4_;
            fVar111 = fVar97 - auVar120._0_4_;
            fVar112 = fVar100 - auVar120._0_4_;
            fVar114 = fVar102 - auVar120._0_4_;
            local_11d8 = (Geometry *)CONCAT44(fStack_11d0,fStack_11d0);
            fStack_11cc = fStack_11d0;
            fVar90 = fVar90 - fStack_11d0;
            fVar98 = fVar98 - fStack_11d0;
            fStack_1240 = fStack_1240 - fStack_11d0;
            fStack_123c = fStack_123c - fStack_11d0;
            fVar105 = fVar104 * local_1138 - fVar90 * auVar120._8_4_;
            fVar147 = fVar111 * local_1138 - fVar98 * auVar120._8_4_;
            fVar113 = fVar112 * local_1138 - fStack_1240 * auVar120._8_4_;
            fVar115 = fVar114 * local_1138 - fStack_123c * auVar120._8_4_;
            fVar89 = fVar89 - (float)local_1238;
            fVar97 = fVar97 - local_1238._4_4_;
            fVar100 = fVar100 - fStack_1230;
            fVar102 = fVar102 - fStack_122c;
            auVar109._8_4_ = fVar89 * fVar161 - fVar169 * fVar142;
            fVar85 = fVar97 * fVar162 - fVar170 * fVar143;
            auVar120._12_4_ = fVar100 * fVar163 - fVar171 * fVar144;
            fVar88 = fVar102 * fVar164 - fVar172 * fVar145;
            _local_1158 = (OccludedFunc8)CONCAT44(auVar120._4_4_,auVar120._4_4_);
            fStack_1150 = auVar120._4_4_;
            fStack_114c = auVar120._4_4_;
            local_1218._48_4_ = (float)local_1218._48_4_ - auVar120._4_4_;
            fStack_11e4 = fStack_11e4 - auVar120._4_4_;
            fStack_11e0 = fStack_11e0 - auVar120._4_4_;
            fStack_11dc = fStack_11dc - auVar120._4_4_;
            fVar91 = (float)local_1218._48_4_ * auVar120._8_4_ - fVar104 * fStack_11c0;
            fVar99 = fStack_11e4 * auVar120._8_4_ - fVar111 * fStack_11c0;
            fVar101 = fStack_11e0 * auVar120._8_4_ - fVar112 * fStack_11c0;
            fVar146 = fStack_11dc * auVar120._8_4_ - fVar114 * fStack_11c0;
            fVar132 = fVar131 * fVar142 - fVar89 * fVar153;
            fVar137 = fVar136 * fVar143 - fVar97 * fVar155;
            fVar139 = fVar138 * fVar144 - fVar100 * fVar157;
            fVar141 = fVar140 * fVar145 - fVar102 * fVar159;
            local_1248 = (RTCIntersectArguments *)CONCAT44(fVar98,fVar90);
            fVar165 = fVar90 * fStack_11c0 - (float)local_1218._48_4_ * local_1138;
            fVar166 = fVar98 * fStack_11c0 - fStack_11e4 * local_1138;
            fVar167 = fStack_1240 * fStack_11c0 - fStack_11e0 * local_1138;
            fVar168 = fStack_123c * fStack_11c0 - fStack_11dc * local_1138;
            local_11c8 = (Intersectors *)CONCAT44(fStack_11c0,fStack_11c0);
            fStack_11bc = fStack_11c0;
            fStack_1134 = local_1138;
            fStack_1130 = local_1138;
            fStack_112c = local_1138;
            auVar109._12_4_ =
                 auVar120._8_4_ * local_1098[0] +
                 local_1138 * auVar109._8_4_ + fStack_11c0 * fVar132;
            fVar86 = auVar120._8_4_ * local_1098[1] + local_1138 * fVar85 + fStack_11c0 * fVar137;
            fVar87 = auVar120._8_4_ * local_1098[2] +
                     local_1138 * auVar120._12_4_ + fStack_11c0 * fVar139;
            fVar148 = auVar120._8_4_ * local_1098[3] + local_1138 * fVar88 + fStack_11c0 * fVar141;
            uVar154 = (uint)auVar109._12_4_ & 0x80000000;
            uVar156 = (uint)fVar86 & 0x80000000;
            uVar158 = (uint)fVar87 & 0x80000000;
            uVar160 = (uint)fVar148 & 0x80000000;
            local_1128._0_4_ =
                 (uint)(fVar142 * fVar165 + fVar153 * fVar91 + fVar161 * fVar105) ^ uVar154;
            local_1128._4_4_ =
                 (uint)(fVar143 * fVar166 + fVar155 * fVar99 + fVar162 * fVar147) ^ uVar156;
            fStack_1120 = (float)((uint)(fVar144 * fVar167 + fVar157 * fVar101 + fVar163 * fVar113)
                                 ^ uVar158);
            fStack_111c = (float)((uint)(fVar145 * fVar168 + fVar159 * fVar146 + fVar164 * fVar115)
                                 ^ uVar160);
            local_1118 = (float)((uint)(fVar165 * fVar89 + fVar91 * fVar131 + fVar105 * fVar169) ^
                                uVar154);
            fStack_1114 = (float)((uint)(fVar166 * fVar97 + fVar99 * fVar136 + fVar147 * fVar170) ^
                                 uVar156);
            fStack_1110 = (float)((uint)(fVar167 * fVar100 + fVar101 * fVar138 + fVar113 * fVar171)
                                 ^ uVar158);
            fStack_110c = (float)((uint)(fVar168 * fVar102 + fVar146 * fVar140 + fVar115 * fVar172)
                                 ^ uVar160);
            fVar89 = ABS(auVar109._12_4_);
            fVar91 = ABS(fVar86);
            local_10f8._0_8_ = CONCAT44(fVar86,auVar109._12_4_) & 0x7fffffff7fffffff;
            local_10f8._8_4_ = ABS(fVar87);
            local_10f8._12_4_ = ABS(fVar148);
            uVar149 = -(uint)((0.0 <= local_1118 && 0.0 <= (float)local_1128._0_4_) &&
                             auVar109._12_4_ != 0.0) & local_ff8 &
                      -(uint)((float)local_1128._0_4_ + local_1118 <= fVar89);
            uVar150 = -(uint)((0.0 <= fStack_1114 && 0.0 <= (float)local_1128._4_4_) &&
                             fVar86 != 0.0) & uStack_ff4 &
                      -(uint)((float)local_1128._4_4_ + fStack_1114 <= fVar91);
            uVar151 = -(uint)((0.0 <= fStack_1110 && 0.0 <= fStack_1120) && fVar87 != 0.0) &
                      uStack_ff0 & -(uint)(fStack_1120 + fStack_1110 <= local_10f8._8_4_);
            uVar152 = -(uint)((0.0 <= fStack_110c && 0.0 <= fStack_111c) && fVar148 != 0.0) &
                      uStack_fec & -(uint)(fStack_111c + fStack_110c <= local_10f8._12_4_);
            lVar66 = uVar64 + lVar66;
            uVar55 = 0;
            auVar47._4_4_ = uVar150;
            auVar47._0_4_ = uVar149;
            auVar47._8_4_ = uVar151;
            auVar47._12_4_ = uVar152;
            iVar51 = movmskps(uVar65,auVar47);
            if (iVar51 == 0) {
              uVar65 = 0;
            }
            else {
              local_1108 = (float)(uVar154 ^
                                  (uint)(fVar104 * local_1098[0] +
                                        fVar90 * auVar109._8_4_ + (float)local_1218._48_4_ * fVar132
                                        ));
              fStack_1104 = (float)(uVar156 ^
                                   (uint)(fVar111 * local_1098[1] +
                                         fVar98 * fVar85 + fStack_11e4 * fVar137));
              fStack_1100 = (float)(uVar158 ^
                                   (uint)(fVar112 * local_1098[2] +
                                         fStack_1240 * auVar120._12_4_ + fStack_11e0 * fVar139));
              fStack_10fc = (float)(uVar160 ^
                                   (uint)(fVar114 * local_1098[3] +
                                         fStack_123c * fVar88 + fStack_11dc * fVar141));
              auVar109._12_4_ = (ray->super_RayK<1>).org.field_0.m128[3];
              bVar43 = auVar109._12_4_ * fVar89 < local_1108;
              bVar44 = auVar109._12_4_ * fVar91 < fStack_1104;
              bVar45 = auVar109._12_4_ * local_10f8._8_4_ < fStack_1100;
              bVar46 = auVar109._12_4_ * local_10f8._12_4_ < fStack_10fc;
              auVar92._4_4_ = -(uint)bVar44;
              auVar92._0_4_ = -(uint)bVar43;
              auVar92._8_4_ = -(uint)bVar45;
              auVar92._12_4_ = -(uint)bVar46;
              auVar34._0_4_ = (ray->super_RayK<1>).tfar;
              auVar34._4_4_ = (ray->super_RayK<1>).mask;
              auVar34._8_4_ = (ray->super_RayK<1>).id;
              auVar34._12_4_ = (ray->super_RayK<1>).flags;
              auVar83._0_4_ =
                   -(uint)(local_1108 <= (float)auVar34._0_4_ * fVar89 && bVar43) & uVar149;
              auVar83._4_4_ =
                   -(uint)(fStack_1104 <= (float)auVar34._0_4_ * fVar91 && bVar44) & uVar150;
              auVar83._8_4_ =
                   -(uint)(fStack_1100 <= (float)auVar34._0_4_ * local_10f8._8_4_ && bVar45) &
                   uVar151;
              auVar83._12_4_ =
                   -(uint)(fStack_10fc <= (float)auVar34._0_4_ * local_10f8._12_4_ && bVar46) &
                   uVar152;
              uVar65 = movmskps(iVar51,auVar83);
              if (uVar65 != 0) {
                local_10d8 = auVar83;
                local_1088 = (Geometry *)CONCAT44(fVar85,auVar109._8_4_);
                uStack_1080 = CONCAT44(fVar88,auVar120._12_4_);
                local_1078 = CONCAT44(fVar137,fVar132);
                uStack_1070 = CONCAT44(fVar141,fVar139);
                _local_1278 = auVar83;
                auVar120 = rcpps(auVar92,local_10f8);
                auVar109._0_4_ = auVar120._12_4_;
                auVar120._0_4_ = (1.0 - fVar89 * auVar120._0_4_) * auVar120._0_4_ + auVar120._0_4_;
                auVar120._4_4_ = (1.0 - fVar91 * auVar120._4_4_) * auVar120._4_4_ + auVar120._4_4_;
                auVar120._8_4_ =
                     (1.0 - local_10f8._8_4_ * auVar120._8_4_) * auVar120._8_4_ + auVar120._8_4_;
                auVar109._0_4_ =
                     (1.0 - local_10f8._12_4_ * auVar109._0_4_) * auVar109._0_4_ + auVar109._0_4_;
                auVar109._8_4_ = local_1108 * auVar120._0_4_;
                auVar109._12_4_ = fStack_1104 * auVar120._4_4_;
                fVar85 = fStack_1100 * auVar120._8_4_;
                fVar86 = fStack_10fc * auVar109._0_4_;
                local_10a8[0] = auVar109._8_4_;
                local_10a8[1] = auVar109._12_4_;
                local_10a8[2] = fVar85;
                local_10a8[3] = fVar86;
                local_10c8[0] = (float)local_1128._0_4_ * auVar120._0_4_;
                local_10c8[1] = (float)local_1128._4_4_ * auVar120._4_4_;
                local_10c8[2] = fStack_1120 * auVar120._8_4_;
                local_10c8[3] = fStack_111c * auVar109._0_4_;
                local_10b8._4_4_ = auVar120._4_4_ * fStack_1114;
                local_10b8._0_4_ = auVar120._0_4_ * local_1118;
                fStack_10b0 = auVar120._8_4_ * fStack_1110;
                fStack_10ac = auVar109._0_4_ * fStack_110c;
                auVar49._4_4_ = auVar109._12_4_;
                auVar49._0_4_ = auVar109._8_4_;
                auVar49._8_4_ = fVar85;
                auVar49._12_4_ = fVar86;
                auVar74 = blendvps(_DAT_01f7a9f0,auVar49,auVar83);
                auVar117._4_4_ = auVar74._0_4_;
                auVar117._0_4_ = auVar74._4_4_;
                auVar117._8_4_ = auVar74._12_4_;
                auVar117._12_4_ = auVar74._8_4_;
                auVar120 = minps(auVar117,auVar74);
                auVar93._0_8_ = auVar120._8_8_;
                auVar93._8_4_ = auVar120._0_4_;
                auVar93._12_4_ = auVar120._4_4_;
                auVar120 = minps(auVar93,auVar120);
                auVar94._0_8_ =
                     CONCAT44(-(uint)(auVar120._4_4_ == auVar74._4_4_) & auVar83._4_4_,
                              -(uint)(auVar120._0_4_ == auVar74._0_4_) & auVar83._0_4_);
                auVar94._8_4_ = -(uint)(auVar120._8_4_ == auVar74._8_4_) & auVar83._8_4_;
                auVar94._12_4_ = -(uint)(auVar120._12_4_ == auVar74._12_4_) & auVar83._12_4_;
                iVar51 = movmskps(uVar65,auVar94);
                if (iVar51 != 0) {
                  auVar83._8_4_ = auVar94._8_4_;
                  auVar83._0_8_ = auVar94._0_8_;
                  auVar83._12_4_ = auVar94._12_4_;
                }
                uVar68 = extractps(auVar34,1);
                uVar65 = movmskps(iVar51,auVar83);
                This = (Intersectors *)0x0;
                auVar120._0_4_ = (float)auVar34._0_4_;
                auVar120._4_4_ = (float)auVar34._4_4_;
                auVar120._8_4_ = (float)auVar34._8_4_;
                auVar120._12_4_ = (float)auVar34._12_4_;
                if (uVar65 != 0) {
                  for (; (uVar65 >> (long)This & 1) == 0;
                      This = (Intersectors *)((long)&This->ptr + 1)) {
                  }
                }
LAB_00d9f4f1:
                auVar109._4_4_ = fStack_124c;
                auVar109._0_4_ = fStack_1250;
                uVar65 = *(uint *)(lVar66 + 0x40 + (long)This * 4);
                pIVar63 = (Intersectors *)(ulong)uVar65;
                pGVar38 = (local_1160->geometries).items[(long)pIVar63].ptr;
                uVar149 = (uint)uVar68;
                if ((pGVar38->mask & uVar149) == 0) {
                  *(undefined4 *)(local_1278 + (long)This * 4) = 0;
                  goto LAB_00d9f55d;
                }
                pRVar42 = *(RTCIntersectArguments **)(local_12a4._4_8_ + 0x10);
                if (pRVar42->filter == (RTCFilterFunctionN)0x0) {
                  pRVar57 = *(RTCRayQueryContext **)(local_12a4._4_8_ + 8);
                  if (pGVar38->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                    auVar120._0_4_ = local_10c8[(long)This];
                    auVar120._4_4_ = *(float *)(local_10b8 + (long)This * 4);
                    (ray->super_RayK<1>).tfar = local_10a8[(long)This];
                    (ray->Ng).field_0.field_0.x = local_1098[(long)This];
                    (ray->Ng).field_0.field_0.y = *(float *)((long)&local_1088 + (long)This * 4);
                    (ray->Ng).field_0.field_0.z = *(float *)((long)&local_1078 + (long)This * 4);
                    ray->u = auVar120._0_4_;
                    ray->v = auVar120._4_4_;
                    uVar149 = *(uint *)(lVar66 + 0x50 + (long)This * 4);
                    This = (Intersectors *)(ulong)uVar149;
                    ray->primID = uVar149;
                    ray->geomID = uVar65;
                    ray->instID[0] = pRVar57->instID[0];
                    uVar65 = pRVar57->instPrimID[0];
                    uVar55 = 0;
                    ray->instPrimID[0] = uVar65;
LAB_00d9fca4:
                    auVar120._0_4_ = (ray->super_RayK<1>).org.field_0.m128[0];
                    fStack_11d0 = (ray->super_RayK<1>).org.field_0.m128[1];
                    auVar120._4_4_ = (ray->super_RayK<1>).org.field_0.m128[2];
                    auVar120._8_4_ = (ray->super_RayK<1>).dir.field_0.m128[0];
                    local_1138 = (ray->super_RayK<1>).dir.field_0.m128[1];
                    fStack_11c0 = (ray->super_RayK<1>).dir.field_0.m128[2];
                    local_11d8 = (Geometry *)CONCAT44(fStack_11d0,fStack_11d0);
                    fStack_11cc = fStack_11d0;
                    fStack_1134 = local_1138;
                    fStack_1130 = local_1138;
                    fStack_112c = local_1138;
                    local_11c8 = (Intersectors *)CONCAT44(fStack_11c0,fStack_11c0);
                    fStack_11bc = fStack_11c0;
                    goto LAB_00d9f1eb;
                  }
                  local_1248 = pRVar42;
                  local_1218._48_4_ = auVar120._0_4_;
                  fStack_11e4 = auVar120._4_4_;
                  fStack_11e0 = auVar120._8_4_;
                  fStack_11dc = auVar120._12_4_;
                }
                else {
                  local_1248 = pRVar42;
                  local_1218._48_4_ = auVar120._0_4_;
                  fStack_11e4 = auVar120._4_4_;
                  fStack_11e0 = auVar120._8_4_;
                  fStack_11dc = auVar120._12_4_;
                  pRVar57 = *(RTCRayQueryContext **)(local_12a4._4_8_ + 8);
                }
                local_11a8 = local_1098[(long)This];
                local_11a4 = *(undefined4 *)((long)&local_1088 + (long)This * 4);
                local_11a0 = *(undefined4 *)((long)&local_1078 + (long)This * 4);
                local_119c = local_10c8[(long)This];
                local_1198 = *(undefined4 *)(local_10b8 + (long)This * 4);
                local_1194 = *(undefined4 *)(lVar66 + 0x50 + (long)This * 4);
                local_1190 = uVar65;
                local_118c = pRVar57->instID[0];
                local_1188 = pRVar57->instPrimID[0];
                local_11c8 = This;
                (ray->super_RayK<1>).tfar = local_10a8[(long)This];
                local_12a4._0_4_ = 0xffffffff;
                local_1218._0_8_ = (Intersectors *)local_12a4;
                local_1218._8_8_ = pGVar38->userPtr;
                local_1218._16_8_ = pRVar57;
                local_1218._24_8_ = ray;
                local_1218._32_8_ = &local_11a8;
                local_1218._40_4_ = 1;
                local_1248 = pRVar42;
                local_1218._48_4_ = auVar120._0_4_;
                fStack_11e4 = auVar120._4_4_;
                fStack_11e0 = auVar120._8_4_;
                fStack_11dc = auVar120._12_4_;
                local_11d8 = pGVar38;
                if (pGVar38->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00d9f707:
                  if ((local_1248->filter != (RTCFilterFunctionN)0x0) &&
                     (((local_1248->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((local_11d8->field_8).field_0x2 & 0x40) != 0)))) {
                    This = (Intersectors *)local_1218;
                    (*local_1248->filter)((RTCFilterFunctionNArguments *)This);
                    if (*(int *)(AccelData **)local_1218._0_8_ == 0) goto LAB_00d9f7a5;
                  }
                  (((Vec3f *)(local_1218._24_8_ + 0x30))->field_0).field_0.x =
                       *(float *)local_1218._32_8_;
                  (((Vec3f *)(local_1218._24_8_ + 0x30))->field_0).field_0.y =
                       *(float *)(local_1218._32_8_ + 4);
                  (((Vec3f *)(local_1218._24_8_ + 0x30))->field_0).field_0.z =
                       *(float *)(local_1218._32_8_ + 8);
                  *(float *)(local_1218._24_8_ + 0x3c) = *(float *)(local_1218._32_8_ + 0xc);
                  *(float *)(local_1218._24_8_ + 0x40) = *(float *)(local_1218._32_8_ + 0x10);
                  *(float *)(local_1218._24_8_ + 0x44) = *(float *)(local_1218._32_8_ + 0x14);
                  *(float *)(local_1218._24_8_ + 0x48) = *(float *)(local_1218._32_8_ + 0x18);
                  *(float *)(local_1218._24_8_ + 0x4c) = *(float *)(local_1218._32_8_ + 0x1c);
                  *(float *)(local_1218._24_8_ + 0x50) = *(float *)(local_1218._32_8_ + 0x20);
                }
                else {
                  This = (Intersectors *)local_1218;
                  (*pGVar38->intersectionFilterN)((RTCFilterFunctionNArguments *)This);
                  if (*(int *)(AccelData **)local_1218._0_8_ != 0) goto LAB_00d9f707;
LAB_00d9f7a5:
                  (ray->super_RayK<1>).tfar = (float)local_1218._48_4_;
                }
                pIVar63 = local_11c8;
                *(undefined4 *)(local_1278 + (long)local_11c8 * 4) = 0;
                auVar120._0_4_ = (ray->super_RayK<1>).tfar;
                auVar120._4_4_ = (float)(ray->super_RayK<1>).mask;
                auVar120._8_4_ = (float)(ray->super_RayK<1>).id;
                auVar120._12_4_ = (float)(ray->super_RayK<1>).flags;
                local_1278._0_4_ = -(uint)(auVar109._8_4_ <= auVar120._0_4_) & local_1278._0_4_;
                local_1278._4_4_ = -(uint)(auVar109._12_4_ <= auVar120._0_4_) & local_1278._4_4_;
                uStack_1270 = -(uint)(fVar85 <= auVar120._0_4_) & uStack_1270;
                uStack_126c = -(uint)(fVar86 <= auVar120._0_4_) & uStack_126c;
                uVar67 = extractps(auVar120,1);
                uVar149 = (uint)uVar67;
                fVar103 = (float)local_1258;
                fVar110 = local_1258._4_4_;
                auVar109._0_4_ = fStack_1250;
                auVar109._4_4_ = fStack_124c;
LAB_00d9f55d:
                local_1248 = (RTCIntersectArguments *)CONCAT44(local_1248._4_4_,uVar149);
                local_1218._48_4_ = auVar120._0_4_;
                fStack_11e4 = auVar120._4_4_;
                fStack_11e0 = auVar120._8_4_;
                fStack_11dc = auVar120._12_4_;
                uVar55 = (undefined4)((ulong)pIVar63 >> 0x20);
                uVar65 = movmskps((int)pIVar63,_local_1278);
                if (uVar65 == 0) goto LAB_00d9fca4;
                BVHNIntersector1<4,16777232,false,embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Moeller<4,true>>>
                ::intersect();
                uVar68 = (ulong)local_1248 & 0xffffffff;
                This = (Intersectors *)local_1218._0_8_;
                fVar103 = (float)local_1258;
                fVar110 = local_1258._4_4_;
                auVar120._0_4_ = (float)local_1218._48_4_;
                auVar120._4_4_ = fStack_11e4;
                auVar120._8_4_ = fStack_11e0;
                auVar120._12_4_ = fStack_11dc;
                goto LAB_00d9f4f1;
              }
            }
LAB_00d9f1eb:
            fVar131 = fVar103 - local_1178;
            fVar132 = fVar110 - fStack_1174;
            fVar136 = auVar109._0_4_ - fStack_1170;
            fVar137 = auVar109._4_4_ - fStack_116c;
            fVar89 = (float)local_12a4._12_4_ - local_1058;
            fVar91 = fStack_1294 - fStack_1054;
            fStack_1170 = fStack_1290 - fStack_1050;
            fStack_116c = fStack_128c - fStack_104c;
            auVar120._12_4_ = local_1288 - local_1068;
            fVar87 = fStack_1284 - fStack_1064;
            fVar88 = fStack_1280 - fStack_1060;
            fVar148 = fStack_127c - fStack_105c;
            fVar112 = (float)local_1238 - fVar103;
            fVar113 = local_1238._4_4_ - fVar110;
            fVar114 = fStack_1230 - auVar109._0_4_;
            fVar115 = fStack_122c - auVar109._4_4_;
            auVar109._8_4_ = local_1048 - (float)local_12a4._12_4_;
            auVar109._12_4_ = fStack_1044 - fStack_1294;
            fVar85 = fStack_1040 - fStack_1290;
            fVar86 = fStack_103c - fStack_128c;
            fVar140 = local_11b8 - local_1288;
            fVar141 = fStack_11b4 - fStack_1284;
            fVar142 = fStack_11b0 - fStack_1280;
            fVar143 = fStack_11ac - fStack_127c;
            _local_1178 = (IntersectFunc8)CONCAT44(fVar91,fVar89);
            local_1098[0] = auVar109._8_4_ * auVar120._12_4_ - fVar140 * fVar89;
            local_1098[1] = auVar109._12_4_ * fVar87 - fVar141 * fVar91;
            local_1098[2] = fVar85 * fVar88 - fVar142 * fStack_1170;
            local_1098[3] = fVar86 * fVar148 - fVar143 * fStack_116c;
            fVar138 = fVar140 * fVar131 - fVar112 * auVar120._12_4_;
            fVar139 = fVar141 * fVar132 - fVar113 * fVar87;
            fStack_1230 = fVar142 * fVar136 - fVar114 * fVar88;
            fStack_122c = fVar143 * fVar137 - fVar115 * fVar148;
            local_11b8 = fVar112 * fVar89 - auVar109._8_4_ * fVar131;
            fStack_11b4 = fVar113 * fVar91 - auVar109._12_4_ * fVar132;
            fStack_11b0 = fVar114 * fStack_1170 - fVar85 * fVar136;
            fStack_11ac = fVar115 * fStack_116c - fVar86 * fVar137;
            fVar103 = fVar103 - auVar120._0_4_;
            fVar110 = fVar110 - auVar120._0_4_;
            fStack_1250 = auVar109._0_4_ - auVar120._0_4_;
            fStack_124c = auVar109._4_4_ - auVar120._0_4_;
            local_12a4._12_4_ = (float)local_12a4._12_4_ - (float)local_11d8;
            fStack_1294 = fStack_1294 - local_11d8._4_4_;
            fStack_1290 = fStack_1290 - fStack_11cc;
            fStack_128c = fStack_128c - fStack_11cc;
            local_1288 = local_1288 - auVar120._4_4_;
            fStack_1284 = fStack_1284 - auVar120._4_4_;
            fStack_1280 = fStack_1280 - auVar120._4_4_;
            fStack_127c = fStack_127c - auVar120._4_4_;
            fVar90 = (float)local_12a4._12_4_ * (float)local_11c8 - local_1288 * fStack_1134;
            fVar97 = fStack_1294 * local_11c8._4_4_ - fStack_1284 * fStack_1134;
            fVar98 = fStack_1290 * fStack_11bc - fStack_1280 * fStack_1134;
            fVar99 = fStack_128c * fStack_11bc - fStack_127c * fStack_1134;
            auVar120._0_4_ = local_1288 * auVar120._8_4_ - fVar103 * (float)local_11c8;
            auVar120._4_4_ = fStack_1284 * auVar120._8_4_ - fVar110 * local_11c8._4_4_;
            auVar109._0_4_ = fStack_1280 * auVar120._8_4_ - fStack_1250 * fStack_11bc;
            auVar109._4_4_ = fStack_127c * auVar120._8_4_ - fStack_124c * fStack_11bc;
            local_1258 = (Intersectors *)CONCAT44(fVar110,fVar103);
            fVar104 = fVar103 * fStack_1134 - (float)local_12a4._12_4_ * auVar120._8_4_;
            fVar105 = fVar110 * fStack_1134 - fStack_1294 * auVar120._8_4_;
            fVar111 = fStack_1250 * fStack_1134 - fStack_1290 * auVar120._8_4_;
            fVar147 = fStack_124c * fStack_1134 - fStack_128c * auVar120._8_4_;
            local_1238 = (Geometry *)CONCAT44(fVar139,fVar138);
            fVar100 = auVar120._8_4_ * local_1098[0] +
                      fStack_1134 * fVar138 + (float)local_11c8 * local_11b8;
            fVar101 = auVar120._8_4_ * local_1098[1] +
                      fStack_1134 * fVar139 + local_11c8._4_4_ * fStack_11b4;
            fVar102 = auVar120._8_4_ * local_1098[2] +
                      fStack_1134 * fStack_1230 + fStack_11bc * fStack_11b0;
            fVar146 = auVar120._8_4_ * local_1098[3] +
                      fStack_1134 * fStack_122c + fStack_11bc * fStack_11ac;
            uVar149 = (uint)fVar100 & 0x80000000;
            uVar150 = (uint)fVar101 & 0x80000000;
            uVar151 = (uint)fVar102 & 0x80000000;
            uVar152 = (uint)fVar146 & 0x80000000;
            fVar112 = (float)((uint)(fVar112 * fVar90 +
                                    auVar109._8_4_ * auVar120._0_4_ + fVar140 * fVar104) ^ uVar149);
            auVar109._12_4_ =
                 (float)((uint)(fVar113 * fVar97 +
                               auVar109._12_4_ * auVar120._4_4_ + fVar141 * fVar105) ^ uVar150);
            fVar85 = (float)((uint)(fVar114 * fVar98 + fVar85 * auVar109._0_4_ + fVar142 * fVar111)
                            ^ uVar151);
            fVar86 = (float)((uint)(fVar115 * fVar99 + fVar86 * auVar109._4_4_ + fVar143 * fVar147)
                            ^ uVar152);
            auVar120._8_4_ =
                 (float)((uint)(fVar90 * fVar131 +
                               auVar120._0_4_ * fVar89 + fVar104 * auVar120._12_4_) ^ uVar149);
            auVar109._8_4_ =
                 (float)((uint)(fVar97 * fVar132 + auVar120._4_4_ * fVar91 + fVar105 * fVar87) ^
                        uVar150);
            auVar109._0_4_ =
                 (float)((uint)(fVar98 * fVar136 + auVar109._0_4_ * fStack_1170 + fVar111 * fVar88)
                        ^ uVar151);
            auVar109._4_4_ =
                 (float)((uint)(fVar99 * fVar137 + auVar109._4_4_ * fStack_116c + fVar147 * fVar148)
                        ^ uVar152);
            auVar120._0_4_ = ABS(fVar100);
            auVar120._4_4_ = ABS(fVar101);
            local_10f8._0_8_ = CONCAT44(fVar101,fVar100) & 0x7fffffff7fffffff;
            local_10f8._8_4_ = ABS(fVar102);
            local_10f8._12_4_ = ABS(fVar146);
            auVar130._0_4_ =
                 -(uint)((0.0 <= fVar112 && 0.0 <= auVar120._8_4_) && fVar100 != 0.0) & local_ff8 &
                 -(uint)(fVar112 + auVar120._8_4_ <= auVar120._0_4_);
            auVar130._4_4_ =
                 -(uint)((0.0 <= auVar109._12_4_ && 0.0 <= auVar109._8_4_) && fVar101 != 0.0) &
                 uStack_ff4 & -(uint)(auVar109._12_4_ + auVar109._8_4_ <= auVar120._4_4_);
            auVar130._8_4_ =
                 -(uint)((0.0 <= fVar85 && 0.0 <= auVar109._0_4_) && fVar102 != 0.0) & uStack_ff0 &
                 -(uint)(fVar85 + auVar109._0_4_ <= local_10f8._8_4_);
            auVar130._12_4_ =
                 -(uint)((0.0 <= fVar86 && 0.0 <= auVar109._4_4_) && fVar146 != 0.0) & uStack_fec &
                 -(uint)(fVar86 + auVar109._4_4_ <= local_10f8._12_4_);
            iVar51 = movmskps(uVar65,auVar130);
            if (iVar51 != 0) {
              local_1108 = (float)(uVar149 ^
                                  (uint)(fVar103 * local_1098[0] +
                                        (float)local_12a4._12_4_ * fVar138 + local_1288 * local_11b8
                                        ));
              fStack_1104 = (float)(uVar150 ^
                                   (uint)(fVar110 * local_1098[1] +
                                         fStack_1294 * fVar139 + fStack_1284 * fStack_11b4));
              fStack_1100 = (float)(uVar151 ^
                                   (uint)(fStack_1250 * local_1098[2] +
                                         fStack_1290 * fStack_1230 + fStack_1280 * fStack_11b0));
              fStack_10fc = (float)(uVar152 ^
                                   (uint)(fStack_124c * local_1098[3] +
                                         fStack_128c * fStack_122c + fStack_127c * fStack_11ac));
              fVar103 = (ray->super_RayK<1>).org.field_0.m128[3];
              bVar43 = fVar103 * auVar120._0_4_ < local_1108;
              bVar44 = fVar103 * auVar120._4_4_ < fStack_1104;
              bVar45 = fVar103 * local_10f8._8_4_ < fStack_1100;
              bVar46 = fVar103 * local_10f8._12_4_ < fStack_10fc;
              auVar118._4_4_ = -(uint)bVar44;
              auVar118._0_4_ = -(uint)bVar43;
              auVar118._8_4_ = -(uint)bVar45;
              auVar118._12_4_ = -(uint)bVar46;
              auVar35._0_4_ = (ray->super_RayK<1>).tfar;
              auVar35._4_4_ = (ray->super_RayK<1>).mask;
              auVar35._8_4_ = (ray->super_RayK<1>).id;
              auVar35._12_4_ = (ray->super_RayK<1>).flags;
              auVar84._0_4_ =
                   -(uint)(local_1108 <= (float)auVar35._0_4_ * auVar120._0_4_ && bVar43) &
                   auVar130._0_4_;
              auVar84._4_4_ =
                   -(uint)(fStack_1104 <= (float)auVar35._0_4_ * auVar120._4_4_ && bVar44) &
                   auVar130._4_4_;
              auVar84._8_4_ =
                   -(uint)(fStack_1100 <= (float)auVar35._0_4_ * local_10f8._8_4_ && bVar45) &
                   auVar130._8_4_;
              auVar84._12_4_ =
                   -(uint)(fStack_10fc <= (float)auVar35._0_4_ * local_10f8._12_4_ && bVar46) &
                   auVar130._12_4_;
              iVar51 = movmskps(iVar51,auVar84);
              if (iVar51 != 0) {
                local_10d8 = auVar84;
                local_1088 = local_1238;
                uStack_1080 = CONCAT44(fStack_122c,fStack_1230);
                local_1078 = CONCAT44(fStack_11b4,local_11b8);
                uStack_1070 = CONCAT44(fStack_11ac,fStack_11b0);
                local_1128._4_4_ = auVar120._4_4_ - auVar109._12_4_;
                local_1128._0_4_ = auVar120._0_4_ - fVar112;
                fStack_1120 = local_10f8._8_4_ - fVar85;
                fStack_111c = local_10f8._12_4_ - fVar86;
                local_1118 = auVar120._0_4_ - auVar120._8_4_;
                fStack_1114 = auVar120._4_4_ - auVar109._8_4_;
                fStack_1110 = local_10f8._8_4_ - auVar109._0_4_;
                fStack_110c = local_10f8._12_4_ - auVar109._4_4_;
                _local_1278 = auVar84;
                auVar74 = rcpps(auVar118,local_10f8);
                auVar120._12_4_ = auVar74._0_4_;
                fVar87 = auVar74._4_4_;
                fVar88 = auVar74._8_4_;
                fVar148 = auVar74._12_4_;
                auVar120._12_4_ =
                     (1.0 - auVar120._0_4_ * auVar120._12_4_) * auVar120._12_4_ + auVar120._12_4_;
                fVar87 = (1.0 - auVar120._4_4_ * fVar87) * fVar87 + fVar87;
                fVar88 = (1.0 - local_10f8._8_4_ * fVar88) * fVar88 + fVar88;
                fVar148 = (1.0 - local_10f8._12_4_ * fVar148) * fVar148 + fVar148;
                local_1288 = local_1108 * auVar120._12_4_;
                fStack_1284 = fStack_1104 * fVar87;
                fVar103 = fStack_1100 * fVar88;
                fVar110 = fStack_10fc * fVar148;
                local_10a8[0] = local_1288;
                local_10a8[1] = fStack_1284;
                local_10a8[2] = fVar103;
                local_10a8[3] = fVar110;
                local_10c8[0] = (auVar120._0_4_ - fVar112) * auVar120._12_4_;
                local_10c8[1] = (auVar120._4_4_ - auVar109._12_4_) * fVar87;
                local_10c8[2] = (local_10f8._8_4_ - fVar85) * fVar88;
                local_10c8[3] = (local_10f8._12_4_ - fVar86) * fVar148;
                local_10b8._0_4_ = auVar120._12_4_ * (auVar120._0_4_ - auVar120._8_4_);
                local_10b8._4_4_ = fVar87 * (auVar120._4_4_ - auVar109._8_4_);
                fStack_10b0 = fVar88 * (local_10f8._8_4_ - auVar109._0_4_);
                fStack_10ac = fVar148 * (local_10f8._12_4_ - auVar109._4_4_);
                auVar48._4_4_ = fStack_1284;
                auVar48._0_4_ = local_1288;
                auVar48._8_4_ = fVar103;
                auVar48._12_4_ = fVar110;
                auVar109 = blendvps(_DAT_01f7a9f0,auVar48,auVar84);
                auVar119._4_4_ = auVar109._0_4_;
                auVar119._0_4_ = auVar109._4_4_;
                auVar119._8_4_ = auVar109._12_4_;
                auVar119._12_4_ = auVar109._8_4_;
                auVar120 = minps(auVar119,auVar109);
                auVar95._0_8_ = auVar120._8_8_;
                auVar95._8_4_ = auVar120._0_4_;
                auVar95._12_4_ = auVar120._4_4_;
                auVar120 = minps(auVar95,auVar120);
                auVar96._0_8_ =
                     CONCAT44(-(uint)(auVar120._4_4_ == auVar109._4_4_) & auVar84._4_4_,
                              -(uint)(auVar120._0_4_ == auVar109._0_4_) & auVar84._0_4_);
                auVar96._8_4_ = -(uint)(auVar120._8_4_ == auVar109._8_4_) & auVar84._8_4_;
                auVar96._12_4_ = -(uint)(auVar120._12_4_ == auVar109._12_4_) & auVar84._12_4_;
                iVar51 = movmskps(iVar51,auVar96);
                if (iVar51 != 0) {
                  auVar84._8_4_ = auVar96._8_4_;
                  auVar84._0_8_ = auVar96._0_8_;
                  auVar84._12_4_ = auVar96._12_4_;
                }
                uVar68 = extractps(auVar35,1);
                uVar52 = movmskps(iVar51,auVar84);
                This = (Intersectors *)0x0;
                auVar109._0_4_ = (float)auVar35._0_4_;
                auVar109._4_4_ = (float)auVar35._4_4_;
                auVar109._8_4_ = (float)auVar35._8_4_;
                auVar109._12_4_ = (float)auVar35._12_4_;
                fStack_11d0 = fStack_11cc;
                fStack_11c0 = fStack_11bc;
                fStack_1130 = fStack_1134;
                fStack_112c = fStack_1134;
                local_1138 = fStack_1134;
                if (CONCAT44(uVar55,uVar52) != 0) {
                  for (; (CONCAT44(uVar55,uVar52) >> (long)This & 1) == 0;
                      This = (Intersectors *)((long)&This->ptr + 1)) {
                  }
                }
                do {
                  uVar65 = *(uint *)(lVar66 + 0x40 + (long)This * 4);
                  pIVar63 = (Intersectors *)(ulong)uVar65;
                  pGVar38 = (local_1160->geometries).items[(long)pIVar63].ptr;
                  uVar149 = (uint)uVar68;
                  if ((pGVar38->mask & uVar149) == 0) {
                    *(undefined4 *)(local_1278 + (long)This * 4) = 0;
                  }
                  else {
                    pRVar42 = *(RTCIntersectArguments **)(local_12a4._4_8_ + 0x10);
                    if (pRVar42->filter == (RTCFilterFunctionN)0x0) {
                      pRVar57 = *(RTCRayQueryContext **)(local_12a4._4_8_ + 8);
                      if (pGVar38->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        auVar120._0_4_ = local_10c8[(long)This];
                        auVar120._4_4_ = *(float *)(local_10b8 + (long)This * 4);
                        (ray->super_RayK<1>).tfar = local_10a8[(long)This];
                        (ray->Ng).field_0.field_0.x = local_1098[(long)This];
                        (ray->Ng).field_0.field_0.y = *(float *)((long)&local_1088 + (long)This * 4)
                        ;
                        (ray->Ng).field_0.field_0.z = *(float *)((long)&local_1078 + (long)This * 4)
                        ;
                        ray->u = auVar120._0_4_;
                        ray->v = auVar120._4_4_;
                        uVar149 = *(uint *)(lVar66 + 0x50 + (long)This * 4);
                        This = (Intersectors *)(ulong)uVar149;
                        ray->primID = uVar149;
                        ray->geomID = uVar65;
                        ray->instID[0] = pRVar57->instID[0];
                        ray->instPrimID[0] = pRVar57->instPrimID[0];
                        break;
                      }
                      fStack_1290 = auVar109._8_4_;
                      fStack_128c = auVar109._12_4_;
                      fStack_1280 = fVar103;
                      fStack_127c = fVar110;
                    }
                    else {
                      fStack_1290 = auVar109._8_4_;
                      fStack_128c = auVar109._12_4_;
                      fStack_1280 = fVar103;
                      fStack_127c = fVar110;
                      pRVar57 = *(RTCRayQueryContext **)(local_12a4._4_8_ + 8);
                    }
                    fStack_1294 = auVar109._4_4_;
                    local_12a4._12_4_ = auVar109._0_4_;
                    local_11a8 = local_1098[(long)This];
                    local_11a4 = *(undefined4 *)((long)&local_1088 + (long)This * 4);
                    local_11a0 = *(undefined4 *)((long)&local_1078 + (long)This * 4);
                    local_119c = local_10c8[(long)This];
                    local_1198 = *(undefined4 *)(local_10b8 + (long)This * 4);
                    local_1194 = *(undefined4 *)(lVar66 + 0x50 + (long)This * 4);
                    local_1190 = uVar65;
                    local_118c = pRVar57->instID[0];
                    local_1188 = pRVar57->instPrimID[0];
                    local_1258 = This;
                    (ray->super_RayK<1>).tfar = local_10a8[(long)This];
                    local_12a4._0_4_ = 0xffffffff;
                    local_1218._0_8_ = (Intersectors *)local_12a4;
                    local_1218._8_8_ = pGVar38->userPtr;
                    local_1218._16_8_ = pRVar57;
                    local_1218._24_8_ = ray;
                    local_1218._32_8_ = &local_11a8;
                    local_1218._40_4_ = 1;
                    local_1238 = pGVar38;
                    fStack_1290 = auVar109._8_4_;
                    fStack_128c = auVar109._12_4_;
                    fStack_1280 = fVar103;
                    fStack_127c = fVar110;
                    if (pGVar38->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00d9fb46:
                      if ((pRVar42->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar42->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_1238->field_8).field_0x2 & 0x40) != 0)))) {
                        This = (Intersectors *)local_1218;
                        (*pRVar42->filter)((RTCFilterFunctionNArguments *)This);
                        if (*(int *)(AccelData **)local_1218._0_8_ == 0) goto LAB_00d9fbde;
                      }
                      (((Vec3f *)(local_1218._24_8_ + 0x30))->field_0).field_0.x =
                           *(float *)local_1218._32_8_;
                      (((Vec3f *)(local_1218._24_8_ + 0x30))->field_0).field_0.y =
                           *(float *)(local_1218._32_8_ + 4);
                      (((Vec3f *)(local_1218._24_8_ + 0x30))->field_0).field_0.z =
                           *(float *)(local_1218._32_8_ + 8);
                      *(float *)(local_1218._24_8_ + 0x3c) = *(float *)(local_1218._32_8_ + 0xc);
                      *(float *)(local_1218._24_8_ + 0x40) = *(float *)(local_1218._32_8_ + 0x10);
                      *(float *)(local_1218._24_8_ + 0x44) = *(float *)(local_1218._32_8_ + 0x14);
                      *(float *)(local_1218._24_8_ + 0x48) = *(float *)(local_1218._32_8_ + 0x18);
                      *(float *)(local_1218._24_8_ + 0x4c) = *(float *)(local_1218._32_8_ + 0x1c);
                      *(float *)(local_1218._24_8_ + 0x50) = *(float *)(local_1218._32_8_ + 0x20);
                    }
                    else {
                      This = (Intersectors *)local_1218;
                      (*pGVar38->intersectionFilterN)((RTCFilterFunctionNArguments *)This);
                      if (*(int *)(AccelData **)local_1218._0_8_ != 0) goto LAB_00d9fb46;
LAB_00d9fbde:
                      (ray->super_RayK<1>).tfar = (float)local_12a4._12_4_;
                    }
                    pIVar63 = local_1258;
                    *(undefined4 *)(local_1278 + (long)local_1258 * 4) = 0;
                    auVar109._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar109._4_4_ = (float)(ray->super_RayK<1>).mask;
                    auVar109._8_4_ = (float)(ray->super_RayK<1>).id;
                    auVar109._12_4_ = (float)(ray->super_RayK<1>).flags;
                    local_1278._0_4_ = -(uint)(local_1288 <= auVar109._0_4_) & local_1278._0_4_;
                    local_1278._4_4_ = -(uint)(fStack_1284 <= auVar109._0_4_) & local_1278._4_4_;
                    uStack_1270 = -(uint)(fStack_1280 <= auVar109._0_4_) & uStack_1270;
                    uStack_126c = -(uint)(fStack_127c <= auVar109._0_4_) & uStack_126c;
                    uVar67 = extractps(auVar109,1);
                    uVar149 = (uint)uVar67;
                    fVar103 = fStack_1280;
                    fVar110 = fStack_127c;
                  }
                  local_12a4._12_4_ = auVar109._0_4_;
                  fStack_1294 = auVar109._4_4_;
                  fStack_1290 = auVar109._8_4_;
                  fStack_128c = auVar109._12_4_;
                  iVar51 = movmskps((int)pIVar63,_local_1278);
                  if (iVar51 == 0) break;
                  fStack_1280 = fVar103;
                  fStack_127c = fVar110;
                  BVHNIntersector1<4,16777232,false,embree::sse42::ArrayIntersector1<embree::sse42::QuadMiMBIntersector1Moeller<4,true>>>
                  ::intersect();
                  uVar68 = (ulong)uVar149;
                  This = (Intersectors *)local_1218._0_8_;
                  auVar109._0_4_ = (float)local_12a4._12_4_;
                  auVar109._4_4_ = fStack_1294;
                  auVar109._8_4_ = fStack_1290;
                  auVar109._12_4_ = fStack_128c;
                  fVar103 = fStack_1280;
                  fVar110 = fStack_127c;
                } while( true );
              }
            }
            local_1000 = local_1000 + 1;
            context = (RayQueryContext *)local_12a4._4_8_;
          } while (local_1000 != local_1038);
        }
        auVar109._0_4_ = (ray->super_RayK<1>).tfar;
        auVar121._4_4_ = auVar109._0_4_;
        auVar121._0_4_ = auVar109._0_4_;
        auVar121._8_4_ = auVar109._0_4_;
        auVar121._12_4_ = auVar109._0_4_;
        uVar64 = local_1220;
        uVar68 = local_1260;
        fVar103 = local_f88;
        fVar110 = fStack_f84;
        auVar109._8_4_ = fStack_f80;
        auVar120._8_4_ = fStack_f7c;
        auVar109._12_4_ = local_f98;
        fVar85 = fStack_f94;
        fVar86 = fStack_f90;
        auVar109._4_4_ = fStack_f8c;
        auVar120._12_4_ = local_fa8;
        fVar87 = fStack_fa4;
        fVar88 = fStack_fa0;
        fVar148 = fStack_f9c;
        fVar89 = local_fb8;
        fVar90 = fStack_fb4;
        fVar91 = fStack_fb0;
        auVar120._0_4_ = fStack_fac;
        fVar97 = local_fc8;
        fVar98 = fStack_fc4;
        fVar99 = fStack_fc0;
        auVar120._4_4_ = fStack_fbc;
        fVar100 = local_fd8;
        fVar101 = fStack_fd4;
        fVar102 = fStack_fd0;
        fVar146 = fStack_fcc;
        fVar104 = local_fe8;
        fVar105 = fStack_fe4;
        fVar111 = fStack_fe0;
        fVar147 = fStack_fdc;
      }
    } while (pauVar53 != (undefined1 (*) [16])&local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }